

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

ggml_tensor * __thiscall
llm_build_rwkv6_base::build_rwkv6_time_mix
          (llm_build_rwkv6_base *this,ggml_cgraph *gf,ggml_tensor *cur,ggml_tensor *x_prev,
          ggml_tensor *state_copy,ggml_tensor *state_mask,llama_ubatch *ubatch,int il)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  const_reference pvVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  long lVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  ggml_tensor *pgVar20;
  ggml_tensor *pgVar21;
  ggml_tensor *pgVar22;
  llm_graph_context *plVar23;
  const_reference ppgVar24;
  long lVar25;
  uint uVar26;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ggml_tensor *in_RSI;
  long in_RDI;
  ggml_tensor *in_R8;
  ggml_cgraph *in_R9;
  bool bVar27;
  double dVar28;
  long in_stack_00000008;
  int in_stack_00000010;
  ggml_tensor *wkv_output;
  ggml_tensor *wkv_state;
  ggml_tensor *w;
  ggml_tensor *tmp;
  ggml_tensor *g;
  ggml_tensor *v;
  ggml_tensor *k;
  ggml_tensor *r;
  ggml_tensor *xg;
  ggml_tensor *xr;
  ggml_tensor *xv;
  ggml_tensor *xk;
  ggml_tensor *xw;
  ggml_tensor *xxx;
  ggml_tensor *sx;
  bool is_qrwkv;
  value_type *layer;
  uint32_t kv_head;
  uint32_t n_head_kv;
  uint32_t n_head;
  uint32_t head_size;
  uint32_t n_embd;
  uint32_t n_seq_tokens;
  uint32_t n_seqs;
  uint32_t n_tokens;
  llama_kv_cache_unified *kv_self;
  undefined8 in_stack_fffffffffffffdb8;
  llama_hparams *in_stack_fffffffffffffdc0;
  ggml_tensor *in_stack_fffffffffffffe10;
  ggml_tensor *in_stack_fffffffffffffe18;
  llm_graph_context *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  int32_t n_state;
  value_type pgVar29;
  llm_graph_context *in_stack_fffffffffffffe50;
  int32_t n_seqs_00;
  undefined8 local_e0;
  undefined8 local_c0;
  ggml_tensor *local_b8;
  ggml_tensor *local_b0;
  ggml_tensor *local_a8;
  undefined8 local_80;
  undefined8 local_18;
  
  n_state = (int32_t)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  uVar8 = (uint32_t)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  lVar25 = *(long *)(in_RDI + 0xe8);
  iVar1 = *(int *)(in_stack_00000008 + 4);
  iVar2 = *(int *)(in_stack_00000008 + 0xc);
  uVar3 = *(undefined4 *)(in_stack_00000008 + 8);
  uVar4 = *(uint *)(*(long *)(in_RDI + 8) + 8);
  uVar5 = *(uint *)(*(long *)(in_RDI + 8) + 0x1894);
  uVar26 = uVar4 / uVar5;
  uVar7 = llama_hparams::n_head_kv(in_stack_fffffffffffffdc0,uVar8);
  iVar6 = *(int *)(lVar25 + 0x68);
  pvVar9 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                     ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                      (*(long *)(in_RDI + 0x108) + 0x19e0),(long)in_stack_00000010);
  bVar27 = pvVar9->time_mix_first == (ggml_tensor *)0x0;
  uVar10 = ggml_sub(*(undefined8 *)(in_RDI + 0xc0),in_RCX,in_RDX);
  uVar11 = ggml_reshape_2d(*(undefined8 *)(in_RDI + 0xc0),uVar10,uVar4,iVar1);
  uVar12 = ggml_reshape_2d(*(undefined8 *)(in_RDI + 0xc0),in_RDX,uVar4,iVar1);
  uVar10 = *(undefined8 *)(in_RDI + 0xc0);
  uVar13 = ggml_mul(*(undefined8 *)(in_RDI + 0xc0),uVar11,pvVar9->time_mix_lerp_x);
  uVar14 = ggml_add(uVar10,uVar13,uVar12);
  uVar10 = *(undefined8 *)(in_RDI + 0xc0);
  uVar13 = *(undefined8 *)(in_RDI + 0xc0);
  uVar14 = ggml_mul_mat(*(undefined8 *)(in_RDI + 0xc0),pvVar9->time_mix_w1,uVar14);
  uVar13 = ggml_tanh(uVar13,uVar14);
  uVar13 = ggml_reshape_4d(uVar10,uVar13,pvVar9->time_mix_w1->ne[1] / 5,1,5,iVar1);
  uVar10 = *(undefined8 *)(in_RDI + 0xc0);
  uVar13 = ggml_permute(*(undefined8 *)(in_RDI + 0xc0),uVar13,0,1,3,2);
  uVar13 = ggml_cont(uVar10,uVar13);
  uVar10 = *(undefined8 *)(in_RDI + 0xc0);
  uVar14 = ggml_reshape_4d(*(undefined8 *)(in_RDI + 0xc0),pvVar9->time_mix_w2,
                           pvVar9->time_mix_w2->ne[0],pvVar9->time_mix_w2->ne[1],1,5);
  lVar15 = ggml_mul_mat(uVar10,uVar14,uVar13);
  if (pvVar9->time_mix_lerp_fused == (ggml_tensor *)0x0) {
    uVar14 = ggml_view_2d(*(undefined8 *)(in_RDI + 0xc0),lVar15,uVar4,iVar1,
                          *(undefined8 *)(lVar15 + 0x38),0);
    uVar16 = ggml_view_2d(*(undefined8 *)(in_RDI + 0xc0),lVar15,uVar4,iVar1,
                          *(undefined8 *)(lVar15 + 0x38),(ulong)(uVar4 * iVar1) << 2);
    uVar17 = ggml_view_2d(*(undefined8 *)(in_RDI + 0xc0),lVar15,uVar4,iVar1,
                          *(undefined8 *)(lVar15 + 0x38),(ulong)(uVar4 * iVar1 * 2) << 2);
    uVar18 = ggml_view_2d(*(undefined8 *)(in_RDI + 0xc0),lVar15,uVar4,iVar1,
                          *(undefined8 *)(lVar15 + 0x38),(ulong)(uVar4 * iVar1 * 3) << 2);
    uVar19 = ggml_view_2d(*(undefined8 *)(in_RDI + 0xc0),lVar15,uVar4,iVar1,
                          *(undefined8 *)(lVar15 + 0x38),(ulong)(uVar4 * iVar1 * 4) << 2);
    uVar10 = *(undefined8 *)(in_RDI + 0xc0);
    uVar13 = *(undefined8 *)(in_RDI + 0xc0);
    uVar14 = ggml_add(*(undefined8 *)(in_RDI + 0xc0),uVar14,pvVar9->time_mix_lerp_w);
    uVar13 = ggml_mul(uVar13,uVar14,uVar11);
    local_80 = ggml_add(uVar10,uVar13,uVar12);
    uVar10 = *(undefined8 *)(in_RDI + 0xc0);
    uVar13 = *(undefined8 *)(in_RDI + 0xc0);
    uVar14 = ggml_add(*(undefined8 *)(in_RDI + 0xc0),uVar16,pvVar9->time_mix_lerp_k);
    uVar13 = ggml_mul(uVar13,uVar14,uVar11);
    ggml_add(uVar10,uVar13,uVar12);
    uVar10 = *(undefined8 *)(in_RDI + 0xc0);
    uVar13 = *(undefined8 *)(in_RDI + 0xc0);
    uVar14 = ggml_add(*(undefined8 *)(in_RDI + 0xc0),uVar17,pvVar9->time_mix_lerp_v);
    uVar13 = ggml_mul(uVar13,uVar14,uVar11);
    ggml_add(uVar10,uVar13,uVar12);
    uVar10 = *(undefined8 *)(in_RDI + 0xc0);
    uVar13 = *(undefined8 *)(in_RDI + 0xc0);
    uVar14 = ggml_add(*(undefined8 *)(in_RDI + 0xc0),uVar18,pvVar9->time_mix_lerp_r);
    uVar13 = ggml_mul(uVar13,uVar14,uVar11);
    ggml_add(uVar10,uVar13,uVar12);
    uVar10 = *(undefined8 *)(in_RDI + 0xc0);
    uVar13 = *(undefined8 *)(in_RDI + 0xc0);
    uVar14 = ggml_add(*(undefined8 *)(in_RDI + 0xc0),uVar19,pvVar9->time_mix_lerp_g);
    uVar13 = ggml_mul(uVar13,uVar14,uVar11);
    ggml_add(uVar10,uVar13,uVar12);
  }
  else {
    uVar11 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar11,uVar4,1,iVar1);
    uVar12 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar12,uVar4,1,iVar1);
    uVar10 = *(undefined8 *)(in_RDI + 0xc0);
    uVar13 = *(undefined8 *)(in_RDI + 0xc0);
    uVar14 = ggml_add(*(undefined8 *)(in_RDI + 0xc0),lVar15,pvVar9->time_mix_lerp_fused);
    uVar13 = ggml_mul(uVar13,uVar14,uVar11);
    lVar15 = ggml_add(uVar10,uVar13,uVar12);
    local_80 = ggml_view_2d(*(undefined8 *)(in_RDI + 0xc0),lVar15,uVar4,iVar1,
                            *(undefined8 *)(lVar15 + 0x38),0);
    ggml_view_2d(*(undefined8 *)(in_RDI + 0xc0),lVar15,uVar4,iVar1,*(undefined8 *)(lVar15 + 0x38),
                 (ulong)(uVar4 * iVar1) << 2);
    ggml_view_2d(*(undefined8 *)(in_RDI + 0xc0),lVar15,uVar4,iVar1,*(undefined8 *)(lVar15 + 0x38),
                 (ulong)(uVar4 * iVar1 * 2) << 2);
    ggml_view_2d(*(undefined8 *)(in_RDI + 0xc0),lVar15,uVar4,iVar1,*(undefined8 *)(lVar15 + 0x38),
                 (ulong)(uVar4 * iVar1 * 3) << 2);
    ggml_view_2d(*(undefined8 *)(in_RDI + 0xc0),lVar15,uVar4,iVar1,*(undefined8 *)(lVar15 + 0x38),
                 (ulong)(uVar4 * iVar1 * 4) << 2);
  }
  local_a8 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                        in_stack_fffffffffffffe10);
  local_b0 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                        in_stack_fffffffffffffe10);
  local_b8 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                        in_stack_fffffffffffffe10);
  if (pvVar9->time_mix_receptance_b != (ggml_tensor *)0x0) {
    local_a8 = (ggml_tensor *)
               ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_a8,pvVar9->time_mix_receptance_b);
  }
  if (pvVar9->time_mix_key_b != (ggml_tensor *)0x0) {
    local_b0 = (ggml_tensor *)
               ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_b0,pvVar9->time_mix_key_b);
  }
  if (pvVar9->time_mix_value_b != (ggml_tensor *)0x0) {
    local_b8 = (ggml_tensor *)
               ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_b8,pvVar9->time_mix_value_b);
  }
  pgVar20 = llm_graph_context::build_lora_mm
                      (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10
                      );
  if (bVar27) {
    local_c0 = ggml_sigmoid(*(undefined8 *)(in_RDI + 0xc0),pgVar20);
  }
  else {
    local_c0 = ggml_silu(*(undefined8 *)(in_RDI + 0xc0),pgVar20);
  }
  if ((uVar7 != 0) && (uVar7 != uVar26)) {
    if (uVar26 % uVar7 != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
                 ,0x2cee,"GGML_ASSERT(%s) failed","n_head % n_head_kv == 0");
    }
    uVar10 = ggml_reshape_4d(*(undefined8 *)(in_RDI + 0xc0),local_b0,uVar5,1,uVar7,iVar1);
    uVar13 = ggml_reshape_4d(*(undefined8 *)(in_RDI + 0xc0),local_b8,uVar5,1,uVar7,iVar1);
    uVar11 = ggml_new_tensor_4d(*(undefined8 *)(in_RDI + 0xc0),0,uVar5,(ulong)uVar26 / (ulong)uVar7,
                                uVar7,iVar1);
    local_b0 = (ggml_tensor *)ggml_repeat(*(undefined8 *)(in_RDI + 0xc0),uVar10,uVar11);
    local_b8 = (ggml_tensor *)ggml_repeat(*(undefined8 *)(in_RDI + 0xc0),uVar13,uVar11);
  }
  local_b0 = (ggml_tensor *)
             ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_b0,uVar5,uVar26,iVar1);
  pgVar21 = (ggml_tensor *)
            ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_b8,uVar5,uVar26,iVar1);
  pgVar22 = (ggml_tensor *)
            ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_a8,uVar5,uVar26,iVar1);
  uVar10 = *(undefined8 *)(in_RDI + 0xc0);
  pgVar20 = pvVar9->time_mix_decay_w2;
  uVar13 = *(undefined8 *)(in_RDI + 0xc0);
  uVar11 = ggml_mul_mat(*(undefined8 *)(in_RDI + 0xc0),pvVar9->time_mix_decay_w1,local_80);
  uVar11 = ggml_tanh(uVar13,uVar11);
  n_seqs_00 = (int32_t)uVar13;
  uVar10 = ggml_mul_mat(uVar10,pgVar20,uVar11);
  uVar11 = ggml_add(*(undefined8 *)(in_RDI + 0xc0),uVar10,pvVar9->time_mix_decay);
  uVar10 = *(undefined8 *)(in_RDI + 0xc0);
  uVar13 = *(undefined8 *)(in_RDI + 0xc0);
  uVar11 = ggml_exp(*(undefined8 *)(in_RDI + 0xc0),uVar11);
  uVar13 = ggml_neg(uVar13,uVar11);
  uVar10 = ggml_exp(uVar10,uVar13);
  plVar23 = (llm_graph_context *)
            ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar10,uVar5,uVar26,iVar1);
  if (bVar27) {
    in_stack_fffffffffffffe50 = *(llm_graph_context **)(in_RDI + 0xc0);
    uVar10 = ggml_mul(*(undefined8 *)(in_RDI + 0xc0),local_b0,plVar23);
    local_b0 = (ggml_tensor *)ggml_sub(in_stack_fffffffffffffe50,local_b0,uVar10);
  }
  pgVar20 = in_RSI;
  ppgVar24 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                       ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)(lVar25 + 0xa8),
                        (long)in_stack_00000010);
  pgVar29 = *ppgVar24;
  llama_hparams::n_embd_v_s(*(llama_hparams **)(in_RDI + 8));
  uVar10 = CONCAT44(uVar8,iVar2);
  pgVar20 = llm_graph_context::build_copy_mask_state
                      (in_stack_fffffffffffffe50,in_R9,in_R8,pgVar29,pgVar20,n_state,n_seqs_00);
  if (bVar27) {
    uVar13 = *(undefined8 *)(in_RDI + 0xc0);
    dVar28 = pow((double)uVar5,-0.5);
    local_e0 = ggml_gated_linear_attn
                         ((float)dVar28,uVar13,local_b0,pgVar21,pgVar22,plVar23,pgVar20,uVar10);
    in_stack_fffffffffffffe10 = pgVar21;
    in_stack_fffffffffffffe18 = pgVar22;
    in_stack_fffffffffffffe20 = plVar23;
  }
  else {
    local_e0 = ggml_rwkv_wkv6(*(undefined8 *)(in_RDI + 0xc0),local_b0,pgVar21,pgVar22,
                              pvVar9->time_mix_first,plVar23,pgVar20);
  }
  uVar11 = ggml_view_1d(*(undefined8 *)(in_RDI + 0xc0),local_e0,uVar4 * iVar1,0);
  uVar12 = ggml_view_1d(*(undefined8 *)(in_RDI + 0xc0),local_e0,uVar4 * uVar5 * iVar2,
                        (ulong)(uVar4 * iVar1) << 2);
  uVar10 = *(undefined8 *)(in_RDI + 0xc0);
  uVar13 = *(undefined8 *)(in_RDI + 0xc0);
  ppgVar24 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                       ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)(lVar25 + 0xa8),
                        (long)in_stack_00000010);
  pgVar29 = *ppgVar24;
  uVar7 = llama_hparams::n_embd_v_s(*(llama_hparams **)(in_RDI + 8));
  uVar8 = llama_hparams::n_embd_v_s(*(llama_hparams **)(in_RDI + 8));
  ppgVar24 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                       ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)(lVar25 + 0xa8),
                        (long)in_stack_00000010);
  lVar25 = ggml_element_size(*ppgVar24);
  uVar13 = ggml_view_1d(uVar13,pgVar29,uVar7 * iVar2,(ulong)(uVar8 * iVar6) * lVar25);
  uVar10 = ggml_cpy(uVar10,uVar12,uVar13);
  ggml_build_forward_expand(in_RSI,uVar10);
  if (bVar27) {
    local_18 = ggml_reshape_2d(*(undefined8 *)(in_RDI + 0xc0),uVar11,uVar4,iVar1);
  }
  else {
    uVar10 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar11,(ulong)uVar4 / (ulong)uVar26,
                             uVar26,iVar1);
    uVar10 = ggml_norm(0x3a27c5ac,*(undefined8 *)(in_RDI + 0xc0),uVar10);
    uVar13 = ggml_reshape_2d(*(undefined8 *)(in_RDI + 0xc0),uVar10,uVar4,iVar1);
    uVar10 = *(undefined8 *)(in_RDI + 0xc0);
    uVar13 = ggml_mul(*(undefined8 *)(in_RDI + 0xc0),uVar13,pvVar9->time_mix_ln);
    local_18 = ggml_add(uVar10,uVar13,pvVar9->time_mix_ln_b);
  }
  ggml_mul(*(undefined8 *)(in_RDI + 0xc0),local_18,local_c0);
  pgVar20 = llm_graph_context::build_lora_mm
                      (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10
                      );
  pgVar20 = (ggml_tensor *)ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar20,uVar4,uVar3,iVar2)
  ;
  return pgVar20;
}

Assistant:

ggml_tensor * build_rwkv6_time_mix(
            ggml_cgraph * gf,
            ggml_tensor * cur,
            ggml_tensor * x_prev,
            ggml_tensor * state_copy,
            ggml_tensor * state_mask,
            const llama_ubatch & ubatch,
            int   il) const {
        const llama_kv_cache_unified * kv_self = static_cast<const llama_kv_cache_unified *>(memory);

        const auto n_tokens = ubatch.n_tokens;
        const auto n_seqs = ubatch.n_seqs;
        const auto n_seq_tokens = ubatch.n_seq_tokens;
        const auto n_embd = hparams.n_embd;
        const auto head_size = hparams.wkv_head_size;
        const auto n_head = n_embd / head_size;
        const auto n_head_kv = hparams.n_head_kv(il);

        const auto kv_head = kv_self->head;

        const auto & layer = model.layers[il];

        bool is_qrwkv = layer.time_mix_first == nullptr;

        ggml_tensor * sx = ggml_sub(ctx0, x_prev, cur);

        sx  = ggml_reshape_2d(ctx0, sx,  n_embd, n_tokens);
        cur = ggml_reshape_2d(ctx0, cur, n_embd, n_tokens);

        ggml_tensor * xxx = ggml_add(ctx0, ggml_mul(ctx0, sx, layer.time_mix_lerp_x), cur);

        xxx = ggml_reshape_4d(
                ctx0,
                ggml_tanh(
                    ctx0,
                    ggml_mul_mat(ctx0, layer.time_mix_w1, xxx)
                    ),
                layer.time_mix_w1->ne[1] / 5, 1, 5, n_tokens
                );

        xxx = ggml_cont(ctx0, ggml_permute(ctx0, xxx, 0, 1, 3, 2));

        xxx = ggml_mul_mat(
                ctx0,
                ggml_reshape_4d(
                    ctx0,
                    layer.time_mix_w2,
                    layer.time_mix_w2->ne[0], layer.time_mix_w2->ne[1], 1, 5
                    ),
                xxx
                );

        ggml_tensor *xw, *xk, *xv, *xr, *xg;
        if (layer.time_mix_lerp_fused) {
            // fusing these weights makes some performance improvement
            sx  = ggml_reshape_3d(ctx0, sx,  n_embd, 1, n_tokens);
            cur = ggml_reshape_3d(ctx0, cur, n_embd, 1, n_tokens);
            xxx = ggml_add(ctx0, ggml_mul(ctx0, ggml_add(ctx0, xxx, layer.time_mix_lerp_fused), sx), cur);
            xw = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], 0);
            xk = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * sizeof(float));
            xv = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 2 * sizeof(float));
            xr = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 3 * sizeof(float));
            xg = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 4 * sizeof(float));
        } else {
            // for backward compatibility
            xw = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], 0);
            xk = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * sizeof(float));
            xv = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 2 * sizeof(float));
            xr = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 3 * sizeof(float));
            xg = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 4 * sizeof(float));

            xw = ggml_add(ctx0, ggml_mul(ctx0, ggml_add(ctx0, xw, layer.time_mix_lerp_w), sx), cur);
            xk = ggml_add(ctx0, ggml_mul(ctx0, ggml_add(ctx0, xk, layer.time_mix_lerp_k), sx), cur);
            xv = ggml_add(ctx0, ggml_mul(ctx0, ggml_add(ctx0, xv, layer.time_mix_lerp_v), sx), cur);
            xr = ggml_add(ctx0, ggml_mul(ctx0, ggml_add(ctx0, xr, layer.time_mix_lerp_r), sx), cur);
            xg = ggml_add(ctx0, ggml_mul(ctx0, ggml_add(ctx0, xg, layer.time_mix_lerp_g), sx), cur);
        }

        ggml_tensor * r = build_lora_mm(layer.time_mix_receptance, xr);
        ggml_tensor * k = build_lora_mm(layer.time_mix_key,        xk);
        ggml_tensor * v = build_lora_mm(layer.time_mix_value,      xv);
        if (layer.time_mix_receptance_b) {
            r = ggml_add(ctx0, r, layer.time_mix_receptance_b);
        }
        if (layer.time_mix_key_b) {
            k = ggml_add(ctx0, k, layer.time_mix_key_b);
        }
        if (layer.time_mix_value_b) {
            v = ggml_add(ctx0, v, layer.time_mix_value_b);
        }

        ggml_tensor * g = build_lora_mm(layer.time_mix_gate, xg);
        if (is_qrwkv) {
            g = ggml_sigmoid(ctx0, g);
        } else {
            g = ggml_silu(ctx0, g);
        }

        if (n_head_kv != 0 && n_head_kv != n_head) {
            GGML_ASSERT(n_head % n_head_kv == 0);
            k = ggml_reshape_4d(ctx0, k, head_size, 1, n_head_kv, n_tokens);
            v = ggml_reshape_4d(ctx0, v, head_size, 1, n_head_kv, n_tokens);
            ggml_tensor * tmp = ggml_new_tensor_4d(ctx0, GGML_TYPE_F32, head_size, n_head / n_head_kv, n_head_kv, n_tokens);
            k = ggml_repeat(ctx0, k, tmp);
            v = ggml_repeat(ctx0, v, tmp);
        }

        k = ggml_reshape_3d(ctx0, k, head_size, n_head, n_tokens);
        v = ggml_reshape_3d(ctx0, v, head_size, n_head, n_tokens);
        r = ggml_reshape_3d(ctx0, r, head_size, n_head, n_tokens);

        ggml_tensor * w = ggml_mul_mat(
                ctx0,
                layer.time_mix_decay_w2,
                ggml_tanh(
                    ctx0,
                    ggml_mul_mat(ctx0, layer.time_mix_decay_w1, xw)
                    )
                );

        w = ggml_add(ctx0, w, layer.time_mix_decay);
        w = ggml_exp(ctx0, ggml_neg(ctx0, ggml_exp(ctx0, w)));
        w = ggml_reshape_3d(ctx0, w, head_size, n_head, n_tokens);

        if (is_qrwkv) {
            // k = k * (1 - w)
            k = ggml_sub(ctx0, k, ggml_mul(ctx0, k, w));
        }

        ggml_tensor * wkv_state = build_copy_mask_state(
                gf, kv_self->v_l[il], state_copy, state_mask,
                hparams.n_embd_v_s(), n_seqs);

        ggml_tensor * wkv_output;
        if (is_qrwkv) {
            wkv_output = ggml_gated_linear_attn(ctx0, k, v, r, w, wkv_state, pow(head_size, -0.5f));
        } else {
            wkv_output = ggml_rwkv_wkv6(ctx0, k, v, r, layer.time_mix_first, w, wkv_state);
        }
        cur = ggml_view_1d(ctx0, wkv_output, n_embd * n_tokens, 0);
        wkv_state = ggml_view_1d(ctx0, wkv_output, n_embd * head_size * n_seqs, n_embd * n_tokens * sizeof(float));

        ggml_build_forward_expand(
                gf,
                ggml_cpy(
                    ctx0,
                    wkv_state,
                    ggml_view_1d(
                        ctx0,
                        kv_self->v_l[il],
                        hparams.n_embd_v_s() * n_seqs,
                        hparams.n_embd_v_s() * kv_head * ggml_element_size(kv_self->v_l[il])
                        )
                    )
                );

        if (!is_qrwkv) {
            // group norm with head_count groups
            cur = ggml_reshape_3d(ctx0, cur, n_embd / n_head, n_head, n_tokens);
            cur = ggml_norm(ctx0, cur, 64e-5f);

            // Convert back to regular vectors.
            cur = ggml_reshape_2d(ctx0, cur, n_embd, n_tokens);
            cur = ggml_add(ctx0, ggml_mul(ctx0, cur, layer.time_mix_ln), layer.time_mix_ln_b);
        } else {
            cur = ggml_reshape_2d(ctx0, cur, n_embd, n_tokens);
        }

        cur = ggml_mul(ctx0, cur, g);
        cur = build_lora_mm(layer.time_mix_output, cur);

        return ggml_reshape_3d(ctx0, cur, n_embd, n_seq_tokens, n_seqs);
    }